

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlChar * xmlSchemaWhiteSpaceReplace(xmlChar *value)

{
  bool bVar1;
  xmlChar *local_30;
  xmlChar *mcur;
  xmlChar *ret;
  xmlChar *cur;
  xmlChar *value_local;
  
  ret = value;
  if (value == (xmlChar *)0x0) {
    value_local = (xmlChar *)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (((*ret != '\0') && (bVar1 = false, *ret != '\r')) && (bVar1 = false, *ret != '\t')) {
        bVar1 = *ret != '\n';
      }
      if (!bVar1) break;
      ret = ret + 1;
    }
    if (*ret == '\0') {
      value_local = (xmlChar *)0x0;
    }
    else {
      value_local = xmlStrdup(value);
      local_30 = value_local + ((long)ret - (long)value);
      do {
        if (((*local_30 == '\r') || (*local_30 == '\t')) || (*local_30 == '\n')) {
          *local_30 = ' ';
        }
        local_30 = local_30 + 1;
      } while (*local_30 != '\0');
    }
  }
  return value_local;
}

Assistant:

xmlChar *
xmlSchemaWhiteSpaceReplace(const xmlChar *value) {
    const xmlChar *cur = value;
    xmlChar *ret = NULL, *mcur;

    if (value == NULL)
	return(NULL);

    while ((*cur != 0) &&
	(((*cur) != 0xd) && ((*cur) != 0x9) && ((*cur) != 0xa))) {
	cur++;
    }
    if (*cur == 0)
	return (NULL);
    ret = xmlStrdup(value);
    /* TODO FIXME: I guess gcc will bark at this. */
    mcur = (xmlChar *)  (ret + (cur - value));
    do {
	if ( ((*mcur) == 0xd) || ((*mcur) == 0x9) || ((*mcur) == 0xa) )
	    *mcur = ' ';
	mcur++;
    } while (*mcur != 0);
    return(ret);
}